

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceSystemMock.cpp
# Opt level: O2

void __thiscall ResourceSystemMock::~ResourceSystemMock(ResourceSystemMock *this)

{
  std::function<void_*(unsigned_long)>::operator=(&_reserve,(nullptr_t)0x0);
  std::function<void_(void_*)>::operator=(&_free,(nullptr_t)0x0);
  testing::internal::FunctionMockerBase<void_(void_*)>::~FunctionMockerBase
            (&(this->gmockconst1_Resource_Free_12).super_FunctionMockerBase<void_(void_*)>);
  testing::internal::FunctionMockerBase<void_*(unsigned_long)>::~FunctionMockerBase
            ((FunctionMockerBase<void_*(unsigned_long)> *)this);
  return;
}

Assistant:

ResourceSystemMock::~ResourceSystemMock()
{
	_reserve = {};
	_free = {};
}